

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffldrc(fitsfile *fptr,long record,int err_mode,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  ulong uVar3;
  long position;
  long lVar4;
  uint nbuff;
  
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  uVar3 = 0x27;
  do {
    iVar2 = (int)uVar3;
    nbuff = fptr->Fptr->ageindex[uVar3];
    if (fptr->Fptr->bufrecnum[(int)nbuff] == record) goto LAB_001bb65a;
    uVar3 = (ulong)(iVar2 - 1);
  } while (iVar2 != 0);
  position = record * 0xb40;
  if ((err_mode == 0) && (fptr->Fptr->logfilesize <= position)) {
    *status = 0x6b;
    iVar2 = 0x6b;
  }
  else {
    pFVar1 = fptr->Fptr;
    nbuff = pFVar1->ageindex[0];
    uVar3 = (ulong)nbuff;
    if ((int)nbuff < 0) {
      *status = 0x67;
      iVar2 = 0x67;
    }
    else {
      if (pFVar1->dirty[uVar3] != 0) {
        ffbfwt(pFVar1,nbuff,status);
      }
      pFVar1 = fptr->Fptr;
      if (position < pFVar1->filesize) {
        if (pFVar1->io_pos != position) {
          ffseek(pFVar1,position);
        }
        ffread(fptr->Fptr,0xb40,fptr->Fptr->iobuffer + uVar3 * 0xb40,status);
        fptr->Fptr->io_pos = position + 0xb40;
      }
      else {
        if (pFVar1->hdutype == 1) {
          iVar2 = 0x20;
        }
        else {
          iVar2 = 0;
        }
        memset(pFVar1->iobuffer + uVar3 * 0xb40,iVar2,0xb40);
        pFVar1 = fptr->Fptr;
        lVar4 = position + 0xb40;
        if (position + 0xb40 < pFVar1->logfilesize) {
          lVar4 = pFVar1->logfilesize;
        }
        pFVar1->logfilesize = lVar4;
        pFVar1->dirty[uVar3] = 1;
      }
      fptr->Fptr->bufrecnum[uVar3] = record;
      uVar3 = 0xffffffff;
LAB_001bb65a:
      pFVar1 = fptr->Fptr;
      pFVar1->curbuf = nbuff;
      if ((int)uVar3 < 0) {
        uVar3 = 0;
        do {
          if (pFVar1->ageindex[uVar3] == nbuff) goto LAB_001bb680;
          uVar3 = uVar3 + 1;
        } while (uVar3 != 0x28);
        uVar3 = 0x28;
      }
LAB_001bb680:
      if ((uint)uVar3 < 0x27) {
        uVar3 = uVar3 & 0xffffffff;
        do {
          pFVar1->ageindex[uVar3] = pFVar1->ageindex[uVar3 + 1];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 0x27);
      }
      pFVar1->ageindex[0x27] = nbuff;
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffldrc(fitsfile *fptr,        /* I - FITS file pointer             */
           long record,           /* I - record number to be loaded    */
           int err_mode,          /* I - 1=ignore EOF, 0 = return EOF error */
           int *status)           /* IO - error status                 */
{
/*
  low-level routine to load a specified record from a file into
  a physical buffer, if it is not already loaded.  Reset all
  pointers to make this the new current record for that file.
  Update ages of all the physical buffers.
*/
    int ibuff, nbuff;
    LONGLONG rstart;

    /* check if record is already loaded in one of the buffers */
    /* search from youngest to oldest buffer for efficiency */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    for (ibuff = NIOBUF - 1; ibuff >= 0; ibuff--)
    {
      nbuff = (fptr->Fptr)->ageindex[ibuff];
      if (record == (fptr->Fptr)->bufrecnum[nbuff]) {
         goto updatebuf;  /* use 'goto' for efficiency */
      }
    }

    /* record is not already loaded */
    rstart = (LONGLONG)record * IOBUFLEN;

    if ( !err_mode && (rstart >= (fptr->Fptr)->logfilesize) )  /* EOF? */
         return(*status = END_OF_FILE);

    if (ffwhbf(fptr, &nbuff) < 0)  /* which buffer should we reuse? */
       return(*status = TOO_MANY_FILES); 

    if ((fptr->Fptr)->dirty[nbuff])
       ffbfwt(fptr->Fptr, nbuff, status); /* write dirty buffer to disk */

    if (rstart >= (fptr->Fptr)->filesize)  /* EOF? */
    {
      /* initialize an empty buffer with the correct fill value */
      if ((fptr->Fptr)->hdutype == ASCII_TBL)
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN); /* blank fill */
      else
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
              rstart + IOBUFLEN);

      (fptr->Fptr)->dirty[nbuff] = TRUE;  /* mark record as having been modified */
    }
    else  /* not EOF, so read record from disk */
    {
      if ((fptr->Fptr)->io_pos != rstart)
           ffseek(fptr->Fptr, rstart);

      ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
      (fptr->Fptr)->io_pos = rstart + IOBUFLEN;  /* set new IO position */
    }

    (fptr->Fptr)->bufrecnum[nbuff] = record;   /* record number contained in buffer */

updatebuf:

    (fptr->Fptr)->curbuf = nbuff; /* this is the current buffer for this file */

    if (ibuff < 0)
    { 
      /* find the current position of the buffer in the age index */
      for (ibuff = 0; ibuff < NIOBUF; ibuff++)
         if ((fptr->Fptr)->ageindex[ibuff] == nbuff)
            break;  
    }

    /* increment the age of all the buffers that were younger than it */
    for (ibuff++; ibuff < NIOBUF; ibuff++)
      (fptr->Fptr)->ageindex[ibuff - 1] = (fptr->Fptr)->ageindex[ibuff];

    (fptr->Fptr)->ageindex[NIOBUF - 1] = nbuff; /* this is now the youngest buffer */
    return(*status);
}